

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_memprof.c
# Opt level: O0

int lj_memprof_start(lua_State *L,lj_memprof_options *opt)

{
  int iVar1;
  int *piVar2;
  lua_Alloc p_Var3;
  undefined8 *in_RSI;
  lua_State *in_RDI;
  uint32_t *unaff_retaddr;
  global_State *in_stack_00000008;
  int saved_errno;
  size_t ljm_header_len;
  alloc *oalloc;
  lj_memprof_options *mp_opt;
  memprof *mp;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  void *src;
  lj_wbuf *buf;
  int local_4;
  
  buf = (lj_wbuf *)&memprof.orig_alloc;
  src = (void *)0x7;
  if (memprof.state == MPS_IDLE) {
    memprof.saved_errno = 0;
    memcpy(&memprof.opt,in_RSI,0x28);
    memprof.g = (global_State *)(ulong)(in_RDI->glref).ptr32;
    memprof.state = MPS_PROFILE;
    lj_wbuf_init(&memprof.out,memprof.opt.writer,memprof.opt.ctx,memprof.opt.buf,memprof.opt.len);
    lj_symtab_dump((lj_wbuf *)ljm_header_len,in_stack_00000008,unaff_retaddr);
    lj_wbuf_addn(buf,src,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar1 = lj_wbuf_test_flag(&memprof.out,'\x03');
    if (iVar1 == 0) {
      p_Var3 = lua_getallocf(in_RDI,&buf->ctx);
      buf->writer = (lj_wbuf_writer)p_Var3;
      lua_setallocf(in_RDI,memprof_allocf,buf->ctx);
      local_4 = 0;
    }
    else {
      iVar1 = lj_wbuf_errno(&memprof.out);
      (*memprof.opt.on_stop)(memprof.opt.ctx,memprof.out.buf);
      lj_wbuf_terminate((lj_wbuf *)0x156ed1);
      memprof.state = MPS_IDLE;
      piVar2 = __errno_location();
      *piVar2 = iVar1;
      local_4 = 4;
    }
  }
  else {
    (*(code *)in_RSI[4])(*in_RSI,in_RSI[1]);
    local_4 = 2;
  }
  return local_4;
}

Assistant:

int lj_memprof_start(struct lua_State *L, const struct lj_memprof_options *opt)
{
  struct memprof *mp = &memprof;
  struct lj_memprof_options *mp_opt = &mp->opt;
  struct alloc *oalloc = &mp->orig_alloc;
  const size_t ljm_header_len = sizeof(ljm_header) / sizeof(ljm_header[0]);

  lj_assertL(opt->writer != NULL, "uninitialized memprof writer");
  lj_assertL(opt->on_stop != NULL, "uninitialized on stop memprof callback");
  lj_assertL(opt->buf != NULL, "uninitialized memprof writer buffer");
  lj_assertL(opt->len != 0, "bad memprof writer buffer length");

  if (mp->state != MPS_IDLE) {
    /* Clean up resources. Ignore possible errors. */
    opt->on_stop(opt->ctx, opt->buf);
    return PROFILE_ERRRUN;
  }

  /* Discard possible old errno. */
  mp->saved_errno = 0;

  /* Init options. */
  memcpy(mp_opt, opt, sizeof(*opt));

  /* Init general fields. */
  mp->g = G(L);
  mp->state = MPS_PROFILE;

  /* Init output. */
  lj_wbuf_init(&mp->out, mp_opt->writer, mp_opt->ctx, mp_opt->buf, mp_opt->len);
  lj_symtab_dump(&mp->out, mp->g, &mp->lib_adds);

  /* Write prologue. */
  lj_wbuf_addn(&mp->out, ljm_header, ljm_header_len);

  if (LJ_UNLIKELY(lj_wbuf_test_flag(&mp->out, STREAM_ERRIO|STREAM_STOP))) {
    /* on_stop call may change errno value. */
    int saved_errno = lj_wbuf_errno(&mp->out);
    /* Ignore possible errors. mp->out.buf may be NULL here. */
    mp_opt->on_stop(mp_opt->ctx, mp->out.buf);
    lj_wbuf_terminate(&mp->out);
    mp->state = MPS_IDLE;
    errno = saved_errno;
    return PROFILE_ERRIO;
  }

  /* Override allocating function. */
  oalloc->allocf = lua_getallocf(L, &oalloc->state);
  lj_assertL(oalloc->allocf != NULL, "uninitialized memprof old alloc function");
  lj_assertL(oalloc->allocf != memprof_allocf,
	     "unexpected memprof old alloc function");
  lua_setallocf(L, memprof_allocf, oalloc->state);

  return PROFILE_SUCCESS;
}